

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall test_app::test_mapping(test_app *this)

{
  test1 *ptVar1;
  bool bVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  allocator local_1b9;
  string local_1b8;
  ostringstream oss;
  
  std::__cxx11::string::string((string *)&local_1b8,"/somepath",&local_1b9);
  u((string *)&oss,this,&this->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/test");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x217);
    std::operator<<(poVar3," u(*this,\"/somepath\")==\"xx/test\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"/foo/somepath",&local_1b9);
  u((string *)&oss,this,&this->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foo/");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x218);
    std::operator<<(poVar3," u(*this,\"/foo/somepath\")==\"xx/foo/\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"/foo/",&local_1b9);
  u((string *)&oss,this,&this->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foo/default");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x219);
    std::operator<<(poVar3," u(*this,\"/foo/\")==\"xx/foo/default\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"/foo",&local_1b9);
  u((string *)&oss,this,&this->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foo/default");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x21a);
    std::operator<<(poVar3," u(*this,\"/foo\")==\"xx/foo/default\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"/foobar/bee/",&local_1b9);
  u((string *)&oss,this,&this->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/default");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x21b);
    std::operator<<(poVar3," u(*this,\"/foobar/bee/\")==\"xx/foobar/bee/default\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"/foobar/bee",&local_1b9);
  u((string *)&oss,this,&this->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/default");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x21c);
    std::operator<<(poVar3," u(*this,\"/foobar/bee\")==\"xx/foobar/bee/default\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"/foobar/bee/bylang",&local_1b9);
  u((string *)&oss,this,&this->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/en");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x21d);
    std::operator<<(poVar3," u(*this,\"/foobar/bee/bylang\")==\"xx/foobar/bee/en\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"somepath",&local_1b9);
  u((string *)&oss,this,&this->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/test");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x21f);
    std::operator<<(poVar3," u(*this,\"somepath\")==\"xx/test\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"foo/somepath",&local_1b9);
  u((string *)&oss,this,&this->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foo/");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x220);
    std::operator<<(poVar3," u(*this,\"foo/somepath\")==\"xx/foo/\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"foobar/bee/somepath",&local_1b9);
  u((string *)&oss,this,&this->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x221);
    std::operator<<(poVar3," u(*this,\"foobar/bee/somepath\")==\"xx/foobar/bee/\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"foobar/bee/bylang",&local_1b9);
  u((string *)&oss,this,&this->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/en");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x222);
    std::operator<<(poVar3," u(*this,\"foobar/bee/bylang\")==\"xx/foobar/bee/en\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"/somepath",&local_1b9);
  ptVar1 = &this->bar;
  u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/test");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x224);
    std::operator<<(poVar3," u(bar,\"/somepath\")==\"xx/test\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"/foo/somepath",&local_1b9);
  u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foo/");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x225);
    std::operator<<(poVar3," u(bar,\"/foo/somepath\")==\"xx/foo/\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"/foobar/bee/somepath",&local_1b9);
  u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x226);
    std::operator<<(poVar3," u(bar,\"/foobar/bee/somepath\")==\"xx/foobar/bee/\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"/foobar/bee/",&local_1b9);
  u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/default");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x227);
    std::operator<<(poVar3," u(bar,\"/foobar/bee/\")==\"xx/foobar/bee/default\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&local_1b8,"/foobar/bee",&local_1b9);
  u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/default");
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_1b8,"/foobar/bee/bylang",&local_1b9);
    u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,"xx/foobar/bee/en");
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x229);
      std::operator<<(poVar3," u(bar,\"/foobar/bee/bylang\")==\"xx/foobar/bee/en\"");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_1b8,"/somepath",&local_1b9);
    ptVar1 = &(this->bee).bee;
    u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,"xx/test");
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x22b);
      std::operator<<(poVar3," u(bee.bee,\"/somepath\")==\"xx/test\"");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_1b8,"/foo/somepath",&local_1b9);
    u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,"xx/foo/");
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x22c);
      std::operator<<(poVar3," u(bee.bee,\"/foo/somepath\")==\"xx/foo/\"");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_1b8,"/foobar/bee/somepath",&local_1b9);
    u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,"xx/foobar/bee/");
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x22d);
      std::operator<<(poVar3," u(bee.bee,\"/foobar/bee/somepath\")==\"xx/foobar/bee/\"");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_1b8,"/foobar/bee/bylang",&local_1b9);
    u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,"xx/foobar/bee/en");
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x22e);
      std::operator<<(poVar3," u(bee.bee,\"/foobar/bee/bylang\")==\"xx/foobar/bee/en\"");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_1b8,"somepath",&local_1b9);
    u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,"xx/foobar/bee/");
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x230);
      std::operator<<(poVar3," u(bee.bee,\"somepath\")==\"xx/foobar/bee/\"");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_1b8,"bylang",&local_1b9);
    u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,"xx/foobar/bee/en");
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x231);
      std::operator<<(poVar3," u(bee.bee,\"bylang\")==\"xx/foobar/bee/en\"");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string((string *)&local_1b8,"../somepath",&local_1b9);
    u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,"xx/foobar/");
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_1b8,"../../somepath",&local_1b9);
      u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &oss,"xx/test");
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_1b8);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar3 = std::operator<<((ostream *)&oss,"Error ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x234);
        std::operator<<(poVar3," u(bee.bee,\"../../somepath\")==\"xx/test\"");
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string((string *)&local_1b8,"bylang",&local_1b9);
      u((string *)&oss,this,&ptVar1->super_application,&local_1b8);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &oss,"xx/foobar/bee/en");
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_1b8);
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_1b8,"../foobar/bee/bylang",&local_1b9);
        u((string *)&oss,this,&(this->foo).super_application,&local_1b8);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&oss,"xx/foobar/bee/en");
        std::__cxx11::string::~string((string *)&oss);
        std::__cxx11::string::~string((string *)&local_1b8);
        if (bVar2) {
          return;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar3 = std::operator<<((ostream *)&oss,"Error ");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x236);
        std::operator<<(poVar3," u(foo,\"../foobar/bee/bylang\")==\"xx/foobar/bee/en\"");
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x235);
      std::operator<<(poVar3," u(bee.bee,\"bylang\")==\"xx/foobar/bee/en\"");
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar3 = std::operator<<((ostream *)&oss,"Error ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x233);
    std::operator<<(poVar3," u(bee.bee,\"../somepath\")==\"xx/foobar/\"");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar3 = std::operator<<((ostream *)&oss,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x228);
  std::operator<<(poVar3," u(bar,\"/foobar/bee\")==\"xx/foobar/bee/default\"");
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar4,(string *)&local_1b8);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_mapping()
	{
		TEST(u(*this,"/somepath")=="xx/test");
		TEST(u(*this,"/foo/somepath")=="xx/foo/");
		TEST(u(*this,"/foo/")=="xx/foo/default");
		TEST(u(*this,"/foo")=="xx/foo/default");
		TEST(u(*this,"/foobar/bee/")=="xx/foobar/bee/default");
		TEST(u(*this,"/foobar/bee")=="xx/foobar/bee/default");
		TEST(u(*this,"/foobar/bee/bylang")=="xx/foobar/bee/en");
		
		TEST(u(*this,"somepath")=="xx/test");
		TEST(u(*this,"foo/somepath")=="xx/foo/");
		TEST(u(*this,"foobar/bee/somepath")=="xx/foobar/bee/");
		TEST(u(*this,"foobar/bee/bylang")=="xx/foobar/bee/en");
		
		TEST(u(bar,"/somepath")=="xx/test");
		TEST(u(bar,"/foo/somepath")=="xx/foo/");
		TEST(u(bar,"/foobar/bee/somepath")=="xx/foobar/bee/");
		TEST(u(bar,"/foobar/bee/")=="xx/foobar/bee/default");
		TEST(u(bar,"/foobar/bee")=="xx/foobar/bee/default");
		TEST(u(bar,"/foobar/bee/bylang")=="xx/foobar/bee/en");
		
		TEST(u(bee.bee,"/somepath")=="xx/test");
		TEST(u(bee.bee,"/foo/somepath")=="xx/foo/");
		TEST(u(bee.bee,"/foobar/bee/somepath")=="xx/foobar/bee/");
		TEST(u(bee.bee,"/foobar/bee/bylang")=="xx/foobar/bee/en");
		
		TEST(u(bee.bee,"somepath")=="xx/foobar/bee/");
		TEST(u(bee.bee,"bylang")=="xx/foobar/bee/en");
		
		TEST(u(bee.bee,"../somepath")=="xx/foobar/");
		TEST(u(bee.bee,"../../somepath")=="xx/test");
		TEST(u(bee.bee,"bylang")=="xx/foobar/bee/en");
		TEST(u(foo,"../foobar/bee/bylang")=="xx/foobar/bee/en");
	}